

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::
specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_dynamic_precision<int>
          (specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
           *this,int arg_id)

{
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *this_00;
  unsigned_long_long uVar1;
  int in_ECX;
  error_handler local_89;
  undefined1 local_88 [32];
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this_00 = this->parse_context_;
  if (0 < this_00->next_arg_id_) {
    local_68.pointer = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"cannot switch from automatic to manual argument indexing","");
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_68.long_long_value,
               local_68.custom.format + (long)local_68.pointer);
    error_handler::on_error((error_handler *)this_00,(string *)local_88);
  }
  this_00->next_arg_id_ = -1;
  get_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
            ((format_arg *)&local_48.string,(internal *)this->context_,
             (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
              *)(ulong)(uint)arg_id,in_ECX);
  local_68.long_long_value = local_48.long_long_value;
  local_68.string.size = local_48.string.size;
  local_58 = local_38;
  uStack_50 = uStack_30;
  local_88._0_8_ = &local_89;
  uVar1 = visit_format_arg<duckdb_fmt::v6::internal::precision_checker<duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((precision_checker<duckdb_fmt::v6::internal::error_handler> *)local_88,
                     (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_68.string);
  if ((uVar1 & 0xffffffff80000000) == 0) {
    ((this->super_specs_setter<char>).specs_)->precision = (int)uVar1;
    return;
  }
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"number is too big","");
  error_handler::on_error(&local_89,(string *)local_88);
}

Assistant:

FMT_CONSTEXPR format_arg get_arg(int arg_id) {
    parse_context_.check_arg_id(arg_id);
    return internal::get_arg(context_, arg_id);
  }